

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void __thiscall
vk::BinaryRegistryDetail::BinaryRegistryWriter::writeToPath
          (BinaryRegistryWriter *this,string *dstPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  pointer pPVar5;
  pointer pPVar6;
  bool bVar7;
  char cVar8;
  deUint32 dVar9;
  pointer pBVar10;
  SparseIndexNode *pSVar11;
  Exception *this_00;
  InternalError *this_01;
  long *plVar12;
  ulong uVar13;
  long lVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  long lVar17;
  pointer id;
  UniquePtr<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
  sparseIndex;
  FilePath filePath;
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  index;
  ofstream out;
  undefined1 local_2d0 [32];
  FilePath local_2b0;
  string *local_290;
  vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  local_288;
  BinaryRegistryWriter *local_268;
  string local_260;
  undefined8 local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  undefined1 local_230 [8];
  pointer local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_220;
  int aiStack_210 [54];
  ios_base local_138 [264];
  
  pcVar2 = (dstPath->_M_dataplus)._M_p;
  local_290 = dstPath;
  local_268 = this;
  local_230 = (undefined1  [8])&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,pcVar2,pcVar2 + dstPath->_M_string_length);
  bVar7 = de::FilePath::exists((FilePath *)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    de::createDirectoryAndParents((local_290->_M_dataplus)._M_p);
  }
  pBVar10 = (local_268->m_binaries).
            super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((local_268->m_binaries).
      super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
      ._M_impl.super__Vector_impl_data._M_finish != pBVar10) {
    local_238 = _VTT;
    local_240 = _operator_delete__;
    lVar17 = 8;
    uVar13 = 0;
    do {
      if (*(long *)((long)&pBVar10->binary + lVar17) == 0) {
        anon_unknown_8::getProgramPath((string *)local_230,local_290,(deUint32)uVar13);
        local_2b0.m_path._M_dataplus._M_p = (pointer)&local_2b0.m_path.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,local_230,(pointer)((long)local_228 + (long)local_230));
        bVar7 = de::FilePath::exists(&local_2b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0.m_path._M_dataplus._M_p != &local_2b0.m_path.field_2) {
          operator_delete(local_2b0.m_path._M_dataplus._M_p,
                          local_2b0.m_path.field_2._M_allocated_capacity + 1);
        }
        if (bVar7) {
          deDeleteFile((char *)local_230);
        }
        uVar15 = local_220._M_allocated_capacity;
        _Var16._M_p = (pointer)local_230;
        if (local_230 != (undefined1  [8])&local_220) goto LAB_00a30d4e;
      }
      else {
        lVar3 = *(long *)((long)pBVar10 + lVar17 + -8);
        anon_unknown_8::getProgramPath(&local_260,local_290,(deUint32)uVar13);
        local_2b0.m_path._M_dataplus._M_p = (pointer)&local_2b0.m_path.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b0,local_260._M_dataplus._M_p,
                   local_260._M_dataplus._M_p + local_260._M_string_length);
        de::FilePath::getDirName_abi_cxx11_((string *)local_2d0,&local_2b0);
        local_230 = (undefined1  [8])&local_220;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_230,local_2d0._0_8_,(pointer)(local_2d0._0_8_ + local_2d0._8_8_))
        ;
        bVar7 = de::FilePath::exists((FilePath *)local_230);
        if (local_230 != (undefined1  [8])&local_220) {
          operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_2d0._0_8_ != local_2d0 + 0x10) {
          operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
        }
        if (!bVar7) {
          de::FilePath::getDirName_abi_cxx11_((string *)local_230,&local_2b0);
          de::createDirectoryAndParents((char *)local_230);
          if (local_230 != (undefined1  [8])&local_220) {
            operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
          }
        }
        std::ofstream::ofstream((string *)local_230,local_260._M_dataplus._M_p,_S_bin);
        cVar8 = std::__basic_file<char>::is_open();
        if ((cVar8 == '\0') ||
           (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) != 0)) {
          this_00 = (Exception *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d0,"Failed to open ",&local_260);
          tcu::Exception::Exception(this_00,(string *)local_2d0);
          __cxa_throw(this_00,&tcu::Exception::typeinfo,tcu::Exception::~Exception);
        }
        lVar4 = *(long *)(lVar3 + 8);
        lVar14 = 0;
        if (*(long *)(lVar3 + 0x10) != lVar4) {
          lVar14 = lVar4;
        }
        std::ostream::write((char *)local_230,lVar14);
        std::ofstream::close();
        local_230 = (undefined1  [8])local_238;
        *(undefined8 *)(local_230 + *(long *)((long)local_238 + -0x18)) = local_240;
        std::filebuf::~filebuf((filebuf *)&local_228);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0.m_path._M_dataplus._M_p != &local_2b0.m_path.field_2) {
          operator_delete(local_2b0.m_path._M_dataplus._M_p,
                          local_2b0.m_path.field_2._M_allocated_capacity + 1);
        }
        uVar15 = local_260.field_2._M_allocated_capacity;
        _Var16._M_p = local_260._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
LAB_00a30d4e:
          operator_delete(_Var16._M_p,uVar15 + 1);
        }
      }
      uVar13 = uVar13 + 1;
      pBVar10 = (local_268->m_binaries).
                super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x10;
    } while (uVar13 < (ulong)((long)(local_268->m_binaries).
                                    super__Vector_base<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot,_std::allocator<vk::BinaryRegistryDetail::BinaryRegistryWriter::BinarySlot>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar10 >> 4)
            );
  }
  anon_unknown_8::getIndexPath((string *)local_230,local_290);
  paVar1 = &local_2b0.m_path.field_2;
  local_2b0.m_path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,local_230,(pointer)((long)local_228 + (long)local_230));
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  local_288.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_288.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (BinaryIndexNode *)0x0;
  local_288.
  super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar5 = (local_268->m_binaryIndices).
           super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar6 = (local_268->m_binaryIndices).
           super__Vector_base<vk::BinaryRegistryDetail::ProgramIdentifierIndex,_std::allocator<vk::BinaryRegistryDetail::ProgramIdentifierIndex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar17 = (long)pPVar6 - (long)pPVar5;
  id = (pointer)0x0;
  if (lVar17 != 0) {
    id = pPVar5;
  }
  pSVar11 = (SparseIndexNode *)operator_new(0x20);
  (pSVar11->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar11->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar11->word = 0;
  pSVar11->index = 0;
  (pSVar11->children).
  super__Vector_base<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d0._0_8_ = pSVar11;
  if (pPVar6 != pPVar5) {
    lVar17 = (lVar17 >> 3) * -0x71c71c71c71c71c7;
    do {
      anon_unknown_8::getSearchPath
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_230,&id->id);
      anon_unknown_8::addToSparseIndex
                (pSVar11,(deUint32 *)local_230,(long)local_228 - (long)local_230 >> 2,id->index);
      if (local_230 != (undefined1  [8])0x0) {
        operator_delete((void *)local_230,local_220._M_allocated_capacity - (long)local_230);
      }
      id = id + 1;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
  }
  anon_unknown_8::normalizeSparseIndex(pSVar11);
  dVar9 = anon_unknown_8::getIndexSize(pSVar11);
  if (dVar9 == 0) {
    std::
    vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::resize(&local_288,1);
    (local_288.
     super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
     ._M_impl.super__Vector_impl_data._M_start)->word = 0;
    (local_288.
     super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
     ._M_impl.super__Vector_impl_data._M_start)->index = 0;
  }
  else {
    std::
    vector<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
    ::resize(&local_288,(ulong)dVar9);
    anon_unknown_8::addAndCountNodes
              (local_288.
               super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
               ._M_impl.super__Vector_impl_data._M_start,0,pSVar11);
  }
  de::details::
  UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
  ::~UniqueBase((UniqueBase<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode,_de::DefaultDeleter<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode>_>
                 *)local_2d0);
  de::FilePath::getDirName_abi_cxx11_((string *)local_2d0,&local_2b0);
  local_230 = (undefined1  [8])&local_220;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_230,local_2d0._0_8_,(pointer)(local_2d0._0_8_ + local_2d0._8_8_));
  bVar7 = de::FilePath::exists((FilePath *)local_230);
  if (local_230 != (undefined1  [8])&local_220) {
    operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
  }
  if ((SparseIndexNode *)local_2d0._0_8_ != (SparseIndexNode *)(local_2d0 + 0x10)) {
    operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
  }
  if (!bVar7) {
    de::FilePath::getDirName_abi_cxx11_((string *)local_230,&local_2b0);
    de::createDirectoryAndParents((char *)local_230);
    if (local_230 != (undefined1  [8])&local_220) {
      operator_delete((void *)local_230,local_220._M_allocated_capacity + 1);
    }
  }
  std::ofstream::ofstream(local_230,local_2b0.m_path._M_dataplus._M_p,_S_bin);
  cVar8 = std::__basic_file<char>::is_open();
  if ((cVar8 != '\0') && (*(int *)((long)aiStack_210 + *(long *)((long)local_230 + -0x18)) == 0)) {
    std::ostream::write(local_230,
                        (long)local_288.
                              super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    local_230 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_230 + *(long *)((long)_VTT + -0x18)) = _operator_delete__;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if (local_288.
        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
        ._M_impl.super__Vector_impl_data._M_start != (BinaryIndexNode *)0x0) {
      operator_delete(local_288.
                      super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_288.
                            super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_288.
                            super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.m_path._M_dataplus._M_p != paVar1) {
      operator_delete(local_2b0.m_path._M_dataplus._M_p,
                      local_2b0.m_path.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  this_01 = (InternalError *)__cxa_allocate_exception(0x38);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_260,"Failed to open program binary index file ","");
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_2d0._0_8_ = *plVar12;
  pSVar11 = (SparseIndexNode *)(plVar12 + 2);
  if ((SparseIndexNode *)local_2d0._0_8_ == pSVar11) {
    local_2d0._16_4_ = pSVar11->word;
    local_2d0._20_4_ = pSVar11->index;
    local_2d0._24_8_ = plVar12[3];
    local_2d0._0_8_ = (SparseIndexNode *)(local_2d0 + 0x10);
  }
  else {
    local_2d0._16_4_ = pSVar11->word;
    local_2d0._20_4_ = pSVar11->index;
  }
  local_2d0._8_8_ = plVar12[1];
  *plVar12 = (long)pSVar11;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::InternalError::InternalError(this_01,(string *)local_2d0);
  __cxa_throw(this_01,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void BinaryRegistryWriter::writeToPath (const std::string& dstPath) const
{
	if (!de::FilePath(dstPath).exists())
		de::createDirectoryAndParents(dstPath.c_str());

	DE_ASSERT(m_binaries.size() <= 0xffffffffu);
	for (size_t binaryNdx = 0; binaryNdx < m_binaries.size(); ++binaryNdx)
	{
		const BinarySlot&	slot	= m_binaries[binaryNdx];

		if (slot.referenceCount > 0)
		{
			DE_ASSERT(slot.binary);
			writeBinary(dstPath, (deUint32)binaryNdx, *slot.binary);
		}
		else
		{
			// Delete stale binary if such exists
			const std::string	progPath	= getProgramPath(dstPath, (deUint32)binaryNdx);

			if (de::FilePath(progPath).exists())
				deDeleteFile(progPath.c_str());
		}

	}

	// Write index
	{
		const de::FilePath				indexPath	= getIndexPath(dstPath);
		std::vector<BinaryIndexNode>	index;

		buildBinaryIndex(&index, m_binaryIndices.size(), !m_binaryIndices.empty() ? &m_binaryIndices[0] : DE_NULL);

		// Even in empty index there is always terminating node for the root group
		DE_ASSERT(!index.empty());

		if (!de::FilePath(indexPath.getDirName()).exists())
			de::createDirectoryAndParents(indexPath.getDirName().c_str());

		{
			std::ofstream indexOut(indexPath.getPath(), std::ios_base::binary);

			if (!indexOut.is_open() || !indexOut.good())
				throw tcu::InternalError(string("Failed to open program binary index file ") + indexPath.getPath());

			indexOut.write((const char*)&index[0], index.size()*sizeof(BinaryIndexNode));
		}
	}
}